

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O1

void Gia_ManTisTest(Gia_Man_t *pInit)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vMffc;
  int *piVar4;
  Vec_Int_t *vLeaves;
  Gia_Man_t *p;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  vMffc = (Vec_Int_t *)malloc(0x10);
  vMffc->nCap = 0x10;
  vMffc->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  vMffc->pArray = piVar4;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 0x10;
  vLeaves->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  vLeaves->pArray = piVar4;
  p = Gia_ManTisDupMuxes(pInit);
  Gia_ManCreateRefs(p);
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(uint *)(&p->pObjs->field_0x0 + lVar8);
      if (((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) && (p->pRefs[lVar7] != 1)) {
        Gia_ManTisCollectMffc(p,(int)lVar7,vMffc,vLeaves);
        Gia_ManTisPrintMffc(p,(int)lVar7,vMffc,vLeaves);
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      iVar6 = pVVar5->pArray[lVar7];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar6;
      iVar6 = iVar6 - (*(uint *)pGVar1 & 0x1fffffff);
      if (p->pRefs[iVar6] < 2) {
        Gia_ManTisCollectMffc(p,iVar6,vMffc,vLeaves);
        pGVar3 = p->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManTisPrintMffc(p,(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555 -
                              (*(uint *)pGVar1 & 0x1fffffff),vMffc,vLeaves);
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCos;
    } while (lVar7 < pVVar5->nSize);
  }
  Gia_ManStop(p);
  if (vMffc->pArray != (int *)0x0) {
    free(vMffc->pArray);
    vMffc->pArray = (int *)0x0;
  }
  free(vMffc);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (int *)0x0;
  }
  free(vLeaves);
  return;
}

Assistant:

void Gia_ManTisTest( Gia_Man_t * pInit )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMffc, * vLeaves;
    int i;
    vMffc = Vec_IntAlloc( 10 );
    vLeaves = Vec_IntAlloc( 10 );
    p = Gia_ManTisDupMuxes( pInit );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, i) == 1 )
            continue;
        Gia_ManTisCollectMffc( p, i, vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, i, vMffc, vLeaves );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0p(p, pObj)) > 1 )
            continue;
        Gia_ManTisCollectMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
    }
    Gia_ManStop( p );
    Vec_IntFree( vMffc );
    Vec_IntFree( vLeaves );
}